

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall
slang::ast::Compilation::checkElemTimeScale
          (Compilation *this,optional<slang::TimeScale> timeScale,SourceRange sourceRange)

{
  char_pointer puVar1;
  pointer puVar2;
  DefinitionSymbol *pDVar3;
  PrimitivePortSymbol *pPVar4;
  SyntaxNode *pSVar5;
  uint uVar6;
  optional<slang::TimeScale> timeScale_00;
  unsigned_long uVar7;
  char_pointer puVar8;
  uint uVar9;
  char_pointer puVar10;
  unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_> *def;
  pointer puVar11;
  table_element_pointer ppVar12;
  undefined1 auVar13 [16];
  SourceRange SVar14;
  iterator iVar15;
  
  if (((uint5)timeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
              super__Optional_payload_base<slang::TimeScale> & 0x100000000) == 0) {
    if (this->anyElemsWithTimescales != false) {
      Scope::addDiag(&((this->root)._M_t.
                       super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                       .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->
                      super_Scope,(DiagCode)0x14000d,sourceRange);
      return;
    }
  }
  else if (this->anyElemsWithTimescales == false) {
    this->anyElemsWithTimescales = true;
    puVar2 = (this->definitionMemory).
             super__Vector_base<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar11 = (this->definitionMemory).
                   super__Vector_base<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar2;
        puVar11 = puVar11 + 1) {
      pDVar3 = (puVar11->_M_t).
               super___uniq_ptr_impl<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::ast::DefinitionSymbol_*,_std::default_delete<slang::ast::DefinitionSymbol>_>
               .super__Head_base<0UL,_slang::ast::DefinitionSymbol_*,_false>._M_head_impl;
      timeScale_00.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
      super__Optional_payload_base<slang::TimeScale> =
           *(_Optional_base<slang::TimeScale,_true,_true> *)
            &(pDVar3->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
             super__Optional_payload_base<slang::TimeScale>;
      SVar14 = parsing::Token::range
                         ((Token *)&(pDVar3->super_Symbol).originatingSyntax[3].parent[2].parent);
      checkElemTimeScale(this,timeScale_00,SVar14);
    }
    iVar15 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
             ::begin(&(this->packageMap).table_);
    if (iVar15.p_ != (table_element_pointer)0x0) {
LAB_002ebc21:
      pPVar4 = (iVar15.p_)->second;
      pSVar5 = (pPVar4->super_ValueSymbol).super_Symbol.originatingSyntax;
      if (pSVar5 != (SyntaxNode *)0x0) {
        uVar7 = (pPVar4->super_ValueSymbol).driverMap.field_0.rootLeaf.
                super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                .first[0].left;
        SVar14 = parsing::Token::range((Token *)&pSVar5[3].parent[2].parent);
        checkElemTimeScale(this,(_Optional_base<slang::TimeScale,_true,_true>)SUB85(uVar7,0),SVar14)
        ;
      }
      puVar8 = iVar15.pc_ + 2;
      do {
        puVar10 = puVar8;
        puVar8 = iVar15.pc_;
        ppVar12 = iVar15.p_ + 1;
        if (((uint)iVar15.pc_ & 0xf) == 0xe) goto LAB_002ebc9d;
        puVar1 = puVar10 + -1;
        iVar15.p_ = ppVar12;
        iVar15.pc_ = puVar8 + 1;
        puVar8 = puVar10 + 1;
      } while (*puVar1 == '\0');
      puVar10 = puVar10 + -1;
      if (*puVar1 == '\x01') {
        ppVar12 = (table_element_pointer)0x0;
      }
      goto LAB_002ebc91;
    }
  }
  return;
LAB_002ebc9d:
  do {
    auVar13[0] = -(*puVar10 == '\0');
    auVar13[1] = -(puVar10[1] == '\0');
    auVar13[2] = -(puVar10[2] == '\0');
    auVar13[3] = -(puVar10[3] == '\0');
    auVar13[4] = -(puVar10[4] == '\0');
    auVar13[5] = -(puVar10[5] == '\0');
    auVar13[6] = -(puVar10[6] == '\0');
    auVar13[7] = -(puVar10[7] == '\0');
    auVar13[8] = -(puVar10[8] == '\0');
    auVar13[9] = -(puVar10[9] == '\0');
    auVar13[10] = -(puVar10[10] == '\0');
    auVar13[0xb] = -(puVar10[0xb] == '\0');
    auVar13[0xc] = -(puVar10[0xc] == '\0');
    auVar13[0xd] = -(puVar10[0xd] == '\0');
    auVar13[0xe] = -(puVar10[0xe] == '\0');
    auVar13[0xf] = -(puVar10[0xf] == '\0');
    uVar9 = (uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe);
    if (uVar9 == 0x7fff) {
      puVar10 = puVar10 + 0x10;
      ppVar12 = ppVar12 + 0xf;
    }
    else {
      uVar6 = 0;
      if ((uVar9 ^ 0x7fff) != 0) {
        for (; ((uVar9 ^ 0x7fff) >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      if (puVar10[uVar6] == '\x01') {
        ppVar12 = (table_element_pointer)0x0;
      }
      else {
        puVar10 = puVar10 + uVar6;
        ppVar12 = ppVar12 + uVar6;
      }
    }
  } while (uVar9 == 0x7fff);
LAB_002ebc91:
  iVar15.p_ = ppVar12;
  iVar15.pc_ = puVar10;
  if (ppVar12 == (table_element_pointer)0x0) {
    return;
  }
  goto LAB_002ebc21;
}

Assistant:

void Compilation::checkElemTimeScale(std::optional<TimeScale> timeScale, SourceRange sourceRange) {
    if (timeScale) {
        if (anyElemsWithTimescales)
            return;

        anyElemsWithTimescales = true;
        for (auto& def : definitionMemory) {
            auto& syntax = def->getSyntax()->as<ModuleDeclarationSyntax>();
            checkElemTimeScale(def->timeScale, syntax.header->name.range());
        }

        for (auto [name, package] : packageMap) {
            if (auto syntax = package->getSyntax()) {
                checkElemTimeScale(package->timeScale,
                                   syntax->as<ModuleDeclarationSyntax>().header->name.range());
            }
        }
    }
    else if (anyElemsWithTimescales) {
        root->addDiag(diag::MissingTimeScale, sourceRange);
    }
}